

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O0

int nn_sock_setopt(nn_sock *self,int level,int option,void *optval,size_t optvallen)

{
  int iVar1;
  undefined4 in_EDX;
  undefined4 in_ESI;
  void *in_RDI;
  int unaff_retaddr;
  int rc;
  
  nn_ctx_enter((nn_ctx *)0x1d0779);
  iVar1 = nn_sock_setopt_inner((nn_sock *)optvallen,rc,unaff_retaddr,in_RDI,CONCAT44(in_ESI,in_EDX))
  ;
  nn_ctx_leave((nn_ctx *)CONCAT44(rc,unaff_retaddr));
  return iVar1;
}

Assistant:

int nn_sock_setopt (struct nn_sock *self, int level, int option,
    const void *optval, size_t optvallen)
{
    int rc;

    nn_ctx_enter (&self->ctx);
    rc = nn_sock_setopt_inner (self, level, option, optval, optvallen);
    nn_ctx_leave (&self->ctx);

    return rc;
}